

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ImageButtonEx
               (ImGuiID id,ImTextureID texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
               ImVec2 *padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  bool bVar1;
  byte bVar2;
  ImU32 IVar3;
  ImVec2 *in_RCX;
  ImVec4 *in_RSI;
  ImVec2 *in_R8;
  ImRect *in_R9;
  float v;
  ImVec2 IVar4;
  long in_stack_00000008;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  ImDrawFlags in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff28;
  ImDrawList *uv_max;
  ImVec4 *in_stack_ffffffffffffff30;
  ImRect *in_stack_ffffffffffffff38;
  ImDrawList *in_stack_ffffffffffffff40;
  ImDrawList *in_stack_ffffffffffffff48;
  ImGuiButtonFlags in_stack_ffffffffffffff54;
  undefined4 uVar5;
  ImVec2 *min;
  bool *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  ImGuiID id_00;
  ImRect *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  float fVar6;
  ImU32 IVar7;
  undefined1 in_stack_ffffffffffffff94;
  byte in_stack_ffffffffffffff96;
  byte in_stack_ffffffffffffff97;
  ImVec2 local_58;
  ImRect local_50;
  ImGuiWindow *local_40;
  ImGuiContext *pIVar8;
  bool local_1;
  
  fVar6 = (float)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  id_00 = (ImGuiID)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  pIVar8 = GImGui;
  local_40 = GetCurrentWindow();
  if ((local_40->SkipItems & 1U) == 0) {
    min = &(local_40->DC).CursorPos;
    operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
              (ImVec2 *)0x1980b4);
    operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0.0);
    local_58 = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         (ImVec2 *)0x1980f0);
    ImRect::ImRect(&local_50,min,&local_58);
    ItemSize((ImRect *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c);
    bVar1 = ItemAdd((ImRect *)in_stack_ffffffffffffff48,
                    (ImGuiID)((ulong)in_stack_ffffffffffffff40 >> 0x20),in_stack_ffffffffffffff38,
                    (ImGuiItemFlags)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    if (bVar1) {
      bVar2 = ButtonBehavior(in_stack_ffffffffffffff70,id_00,in_stack_ffffffffffffff60,(bool *)min,
                             in_stack_ffffffffffffff54);
      if (((in_stack_ffffffffffffff96 & 1) == 0) || ((in_stack_ffffffffffffff97 & 1) == 0)) {
        uVar5 = 0x15;
        if ((in_stack_ffffffffffffff97 & 1) != 0) {
          uVar5 = 0x16;
        }
      }
      else {
        uVar5 = 0x17;
      }
      IVar3 = GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                          SUB84(in_stack_ffffffffffffff30,0));
      RenderNavHighlight(in_R9,(ImGuiID)((ulong)pIVar8 >> 0x20),(ImGuiNavHighlightFlags)pIVar8);
      IVar7 = IVar3;
      v = ImMin<float>((in_R9->Min).x,(in_R9->Min).y);
      ImClamp<float>(v,0.0,(pIVar8->Style).FrameRounding);
      IVar4.y._0_1_ = in_stack_ffffffffffffff94;
      IVar4.x = (float)IVar7;
      IVar4.y._1_1_ = bVar2;
      IVar4.y._2_1_ = in_stack_ffffffffffffff96;
      IVar4.y._3_1_ = in_stack_ffffffffffffff97;
      RenderFrame(IVar4,local_50.Min,(ImU32)local_50.Max.y,local_50.Max.x._3_1_,fVar6);
      if (0.0 < *(float *)(in_stack_00000008 + 0xc)) {
        in_stack_ffffffffffffff48 = local_40->DrawList;
        operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                  (ImVec2 *)0x198284);
        operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                  (ImVec2 *)0x19829f);
        GetColorU32(in_stack_ffffffffffffff30);
        ImDrawList::AddRectFilled
                  (in_stack_ffffffffffffff40,&in_stack_ffffffffffffff38->Min,
                   (ImVec2 *)in_stack_ffffffffffffff30,
                   (ImU32)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                   (float)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
      }
      uv_max = local_40->DrawList;
      operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                (ImVec2 *)0x198304);
      IVar4 = operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                        (ImVec2 *)0x19831f);
      fVar6 = IVar4.x;
      GetColorU32(in_RSI);
      ImDrawList::AddImage
                ((ImDrawList *)CONCAT44(uVar5,IVar3),in_stack_ffffffffffffff48,in_R8,in_RCX,
                 (ImVec2 *)in_RSI,(ImVec2 *)uv_max,(ImU32)fVar6);
      local_1 = (bool)(bVar2 & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ImageButtonEx(ImGuiID id, ImTextureID texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec2& padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size + padding * 2);
    ItemSize(bb);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, ImClamp((float)ImMin(padding.x, padding.y), 0.0f, g.Style.FrameRounding));
    if (bg_col.w > 0.0f)
        window->DrawList->AddRectFilled(bb.Min + padding, bb.Max - padding, GetColorU32(bg_col));
    window->DrawList->AddImage(texture_id, bb.Min + padding, bb.Max - padding, uv0, uv1, GetColorU32(tint_col));

    return pressed;
}